

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupRowVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int **p;
  int **p_00;
  int **p_01;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  int **p_02;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  iterator __position;
  pointer pnVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  int32_t iVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  pointer pnVar17;
  long lVar18;
  pointer pnVar19;
  int *piVar20;
  pointer pnVar21;
  long lVar22;
  byte bVar23;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar23 = 0;
  iVar1 = (this->l).firstUpdate;
  piVar4 = (this->l).start;
  iVar15 = piVar4[iVar1];
  pnVar21 = (this->l).rval.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar21 !=
      (this->l).rval.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->l).rval.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar21;
  }
  piVar5 = (this->l).row;
  pnVar21 = (this->l).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar20 = (this->l).idx;
  p = &(this->l).ridx;
  piVar6 = (this->l).ridx;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    *p = (int *)0x0;
  }
  p_00 = &(this->l).rbeg;
  piVar6 = (this->l).rbeg;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    *p_00 = (int *)0x0;
  }
  p_01 = &(this->l).rorig;
  piVar6 = (this->l).rorig;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    *p_01 = (int *)0x0;
  }
  this_00 = &(this->l).rval;
  p_02 = &(this->l).rperm;
  piVar6 = (this->l).rperm;
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    *p_02 = (int *)0x0;
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)iVar15);
  __position._M_current =
       (this->l).rval.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_b0,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::_M_fill_insert(this_00,__position,(long)iVar15,(value_type *)&local_b0);
  spx_alloc<int*>(p,iVar15);
  spx_alloc<int*>(p_00,this->thedim + 1);
  spx_alloc<int*>(p_01,this->thedim);
  spx_alloc<int*>(p_02,this->thedim);
  piVar6 = (this->l).ridx;
  pnVar7 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar8 = (this->l).rbeg;
  iVar16 = this->thedim;
  piVar14 = piVar8;
  if (iVar16 != 0) {
    piVar14 = (this->row).orig;
    piVar9 = (this->row).perm;
    piVar10 = (this->l).rperm;
    piVar11 = (this->l).rorig;
    lVar18 = 0;
    lVar22 = 0;
    do {
      piVar11[lVar22] = piVar14[lVar22];
      piVar10[lVar22] = piVar9[lVar22];
      piVar8[lVar22] = 0;
      lVar22 = lVar22 + 1;
      lVar18 = lVar18 + -4;
    } while (iVar16 != (int)lVar22);
    piVar14 = (int *)((long)piVar8 - lVar18);
  }
  *piVar14 = 0;
  if (iVar15 != 0) {
    lVar18 = 0;
    do {
      piVar8[(long)piVar20[lVar18] + 1] = piVar8[(long)piVar20[lVar18] + 1] + 1;
      lVar18 = lVar18 + 1;
    } while (iVar15 != (int)lVar18);
  }
  piVar20 = (this->l).idx;
  iVar15 = this->thedim;
  if (iVar15 != 0) {
    lVar18 = 0;
    iVar16 = 0;
    do {
      iVar2 = piVar8[lVar18 + 1];
      piVar8[lVar18 + 1] = iVar16;
      lVar18 = lVar18 + 1;
      iVar16 = iVar2 + iVar16;
    } while (iVar15 != (int)lVar18);
  }
  if (0 < iVar1) {
    iVar15 = 0;
    lVar18 = 0;
    do {
      lVar22 = lVar18 + 1;
      if (iVar15 < piVar4[lVar18 + 1]) {
        iVar16 = piVar5[lVar18];
        do {
          iVar2 = *piVar20;
          piVar20 = piVar20 + 1;
          iVar3 = piVar8[(long)iVar2 + 1];
          piVar8[(long)iVar2 + 1] = iVar3 + 1;
          piVar6[iVar3] = iVar16;
          pnVar17 = pnVar21;
          pnVar19 = pnVar7 + iVar3;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
            pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar23 * -2 + 1) * 4);
            pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          pnVar7[iVar3].m_backend.exp = (pnVar21->m_backend).exp;
          pnVar7[iVar3].m_backend.neg = (pnVar21->m_backend).neg;
          pcVar12 = &pnVar21->m_backend;
          iVar13 = (pnVar21->m_backend).prec_elem;
          pnVar21 = pnVar21 + 1;
          pnVar7[iVar3].m_backend.fpclass = pcVar12->fpclass;
          pnVar7[iVar3].m_backend.prec_elem = iVar13;
          iVar15 = iVar15 + 1;
        } while (iVar15 < piVar4[lVar22]);
      }
      lVar18 = lVar22;
    } while (lVar22 != iVar1);
  }
  return;
}

Assistant:

void CLUFactor<R>::setupRowVals()
{
   int   i, j, k, m;
   int   vecs, mem;
   int*  l_row;
   int*  idx;
   R* val;
   int*  beg;
   int*  l_ridx;
   R* l_rval;
   int*  l_rbeg;
   int*  rorig;
   int*  rrorig;
   int*  rperm;
   int*  rrperm;

   vecs  = l.firstUpdate;
   l_row = l.row;
   idx   = l.idx;
   val   = l.val.data();
   beg   = l.start;
   mem   = beg[vecs];

   if(!l.rval.empty())
   {
      l.rval.clear();
   }


   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   l.rval.reserve(mem);         // small performance improvement before the insertion
   // Insert mem number of zeros.
   l.rval.insert(l.rval.begin(), mem, 0);

   spx_alloc(l.ridx, mem);

   spx_alloc(l.rbeg, thedim + 1);

   spx_alloc(l.rorig, thedim);

   spx_alloc(l.rperm, thedim);

   l_ridx = l.ridx;

   l_rval = l.rval.data();

   l_rbeg = l.rbeg;

   rorig  = l.rorig;

   rrorig = row.orig;

   rperm  = l.rperm;

   rrperm = row.perm;

   for(i = thedim; i--; *l_rbeg++ = 0)
   {
      *rorig++ = *rrorig++;
      *rperm++ = *rrperm++;
   }

   *l_rbeg = 0;

   l_rbeg = l.rbeg + 1;

   for(i = mem; i--;)
      l_rbeg[*idx++]++;

   idx = l.idx;

   for(m = 0, i = thedim; i--; l_rbeg++)
   {
      j = *l_rbeg;
      *l_rbeg = m;
      m += j;
   }

   assert(m == mem);

   l_rbeg = l.rbeg + 1;

   for(i = j = 0; i < vecs; ++i)
   {
      m = l_row[i];
      assert(idx == &l.idx[l.start[i]]);

      for(; j < beg[i + 1]; j++)
      {
         k = l_rbeg[*idx++]++;
         assert(k < mem);
         l_ridx[k] = m;
         l_rval[k] = *val++;
      }
   }

   assert(l.rbeg[thedim] == mem);

   assert(l.rbeg[0] == 0);
}